

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# context.c
# Opt level: O0

void lws_context_destroy3(lws_context *context)

{
  lws_context **pplVar1;
  char **ppcVar2;
  lws_context_per_thread *pt_00;
  lws_system_blob_t *b;
  char **ppcVar3;
  lws_role_ops *ar;
  lws_role_ops **ppxx;
  lws_context_per_thread *pt;
  int n;
  lws_context **pcontext_finalize;
  lws_context *context_local;
  
  pplVar1 = context->pcontext_finalize;
  _lws_log(0x10,"%s\n","lws_context_destroy3");
  for (pt._4_4_ = 0; (int)pt._4_4_ < (int)context->count_threads; pt._4_4_ = pt._4_4_ + 1) {
    pt_00 = context->pt + (int)pt._4_4_;
    lws_seq_destroy_all_on_pt(pt_00);
    ar = (lws_role_ops *)available_roles;
    while (ar->name != (char *)0x0) {
      ppcVar3 = &ar->alpn;
      ppcVar2 = &ar->name;
      ar = (lws_role_ops *)ppcVar3;
      if (*(long *)(*ppcVar2 + 0x18) != 0) {
        (**(code **)(*ppcVar2 + 0x18))(context,0,pt_00,1);
      }
    }
    if (context->event_loop_ops->destroy_pt != (_func_void_lws_context_ptr_int *)0x0) {
      (*context->event_loop_ops->destroy_pt)(context,pt._4_4_);
    }
    while ((pt_00->http).ah_list != (allocated_headers *)0x0) {
      _lws_destroy_ah(pt_00,(pt_00->http).ah_list);
    }
  }
  if (context->pt[0].fds != (pollfd *)0x0) {
    lws_realloc(context->pt[0].fds,0,"free");
    context->pt[0].fds = (pollfd *)0x0;
  }
  lws_context_deinit_ssl_library(context);
  for (pt._4_4_ = LWS_SYSBLOB_TYPE_AUTH; (int)pt._4_4_ < 8; pt._4_4_ = pt._4_4_ + 1) {
    b = lws_system_get_blob(context,pt._4_4_,0);
    lws_system_blob_destroy(b);
  }
  lws_realloc(context,0,"lws_free");
  _lws_log(8,"%s: ctx %p freed\n","lws_context_destroy3",context);
  if (pplVar1 != (lws_context **)0x0) {
    *pplVar1 = (lws_context *)0x0;
  }
  return;
}

Assistant:

static void
lws_context_destroy3(struct lws_context *context)
{
	struct lws_context **pcontext_finalize = context->pcontext_finalize;
	int n;

#if defined(LWS_WITH_NETWORK)

	lwsl_debug("%s\n", __func__);

	for (n = 0; n < context->count_threads; n++) {
		struct lws_context_per_thread *pt = &context->pt[n];
		(void)pt;
#if defined(LWS_WITH_SEQUENCER)
		lws_seq_destroy_all_on_pt(pt);
#endif
		LWS_FOR_EVERY_AVAILABLE_ROLE_START(ar) {
			if (ar->pt_init_destroy)
				ar->pt_init_destroy(context, NULL, pt, 1);
		} LWS_FOR_EVERY_AVAILABLE_ROLE_END;

#if defined(LWS_WITH_CGI)
		role_ops_cgi.pt_init_destroy(context, NULL, pt, 1);
#endif

		if (context->event_loop_ops->destroy_pt)
			context->event_loop_ops->destroy_pt(context, n);

#if defined(LWS_ROLE_H1) || defined(LWS_ROLE_H2)
		while (pt->http.ah_list)
			_lws_destroy_ah(pt, pt->http.ah_list);
#endif
	}

#if defined(LWS_WITH_SYS_ASYNC_DNS)
	lws_async_dns_deinit(&context->async_dns);
#endif
#if defined(LWS_WITH_SYS_DHCP_CLIENT)
	lws_dhcpc_remove(context, NULL);
#endif

	if (context->pt[0].fds)
		lws_free_set_NULL(context->pt[0].fds);
#endif
	lws_context_deinit_ssl_library(context);

#if defined(LWS_WITH_DETAILED_LATENCIES)
	if (context->latencies_fd != -1)
		compatible_close(context->latencies_fd);
#endif

	for (n = 0; n < LWS_SYSBLOB_TYPE_COUNT; n++)
		lws_system_blob_destroy(
				lws_system_get_blob(context, n, 0));

	lws_free(context);
	lwsl_info("%s: ctx %p freed\n", __func__, context);

	if (pcontext_finalize)
		*pcontext_finalize = NULL;
}